

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O0

void dec_derive_skip_mv_umve(com_core_t *core,int umve_idx)

{
  int iVar1;
  s8 local_1e [2];
  int base_idx;
  s8 refi_base_cands [2];
  s16 pmv_base_cands [2] [2];
  int umve_idx_local;
  com_core_t *core_local;
  
  iVar1 = derive_umve_base_motions(core,umve_idx / 0x14,(s16 (*) [2])&base_idx,local_1e);
  if (iVar1 != 0) {
    derive_temporal_motions(core,(s16 (*) [2])&base_idx,local_1e);
  }
  derive_umve_final_motions(core,umve_idx,(s16 (*) [2])&base_idx,local_1e);
  return;
}

Assistant:

void dec_derive_skip_mv_umve(com_core_t * core, int umve_idx)
{
    s16 pmv_base_cands[REFP_NUM][MV_D];
    s8  refi_base_cands[REFP_NUM];
    int base_idx = umve_idx / UMVE_MAX_REFINE_NUM;

    if (derive_umve_base_motions(core, base_idx, pmv_base_cands, refi_base_cands)) {
        derive_temporal_motions(core, pmv_base_cands, refi_base_cands);
    } 
    derive_umve_final_motions(core, umve_idx, pmv_base_cands, refi_base_cands);
}